

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O0

qint64 __thiscall
QGregorianCalendar::matchCenturyToWeekday(QGregorianCalendar *this,YearMonthDay *parts,int dow)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  R_conflict16 RVar5;
  longlong *plVar6;
  int in_EDX;
  int *in_RSI;
  long in_FS_OFFSET;
  int centuryMod4_1;
  int year_1;
  int centuryMod4;
  int year;
  int diff;
  R_conflict16 yearSplit_1;
  R_conflict16 yearSplit;
  optional<long_long> maybe;
  undefined8 in_stack_ffffffffffffff70;
  int local_84;
  int local_7c;
  longlong local_50;
  int iStack_44;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  julianFromParts((int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_EDX);
  bVar2 = std::optional::operator_cast_to_bool((optional<long_long> *)0x57a820);
  if (bVar2) {
    std::optional<long_long>::operator*((optional<long_long> *)0x57a836);
    iVar3 = weekDayOfJulian(0x57a83e);
    if (iVar3 == in_EDX) {
      plVar6 = std::optional<long_long>::operator*((optional<long_long> *)0x57a85a);
      local_50 = *plVar6;
      goto LAB_0057ab0e;
    }
    if (*in_RSI < 0) {
      local_7c = *in_RSI + 1;
    }
    else {
      local_7c = *in_RSI;
    }
    QRoundingDown::qDivMod<100U,_int,_true>(local_7c - (uint)(in_RSI[1] < 3));
    QRoundingDown::qMod<4u,int>(iVar4);
    iVar3 = QRoundingDown::qMod<7u,int>(iVar4);
    if (iVar3 < 4) {
      QRoundingDown::qMod<7u,int>(iVar4);
      julianFromParts((int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_EDX);
      bVar2 = std::optional::operator_cast_to_bool((optional<long_long> *)0x57a97a);
      if (bVar2) {
        std::optional<long_long>::operator*((optional<long_long> *)0x57a98d);
        iVar4 = weekDayOfJulian(0x57a995);
        if (iVar4 == in_EDX) {
          plVar6 = std::optional<long_long>::operator*((optional<long_long> *)0x57a9a8);
          local_50 = *plVar6;
          goto LAB_0057ab0e;
        }
      }
    }
  }
  else if ((in_RSI[1] == 2) && (in_RSI[2] == 0x1d)) {
    if (*in_RSI < 0) {
      local_84 = *in_RSI + 1;
    }
    else {
      local_84 = *in_RSI;
    }
    RVar5 = QRoundingDown::qDivMod<100U,_int,_true>(local_84);
    iStack_44 = RVar5.remainder;
    if (iStack_44 == 0) {
      QRoundingDown::qMod<4u,int>(iVar4);
      julianFromParts((int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_EDX);
      bVar2 = std::optional::operator_cast_to_bool((optional<long_long> *)0x57aac6);
      if (bVar2) {
        std::optional<long_long>::operator*((optional<long_long> *)0x57aad9);
        iVar4 = weekDayOfJulian(0x57aae1);
        if (iVar4 == in_EDX) {
          plVar6 = std::optional<long_long>::operator*((optional<long_long> *)0x57aaf4);
          local_50 = *plVar6;
          goto LAB_0057ab0e;
        }
      }
    }
  }
  local_50 = std::numeric_limits<long_long>::min();
LAB_0057ab0e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_50;
  }
  __stack_chk_fail();
}

Assistant:

qint64
QGregorianCalendar::matchCenturyToWeekday(const QCalendar::YearMonthDay &parts, int dow) const
{
    /* The Gregorian four-century cycle is a whole number of weeks long, so we
       only need to consider four centuries, from previous through next-but-one.
       There are thus three days of the week that can't happen, for any given
       day-of-month, month and year-mod-100. (Exception: '00 Feb 29 has only one
       option.)
    */
    auto maybe = julianFromParts(parts.year, parts.month, parts.day);
    if (maybe) {
        int diff = weekDayOfJulian(*maybe) - dow;
        if (!diff)
            return *maybe;
        int year = parts.year < 0 ? parts.year + 1 : parts.year;
        // What matters is the placement of leap days, so dates before March
        // effectively belong with the dates since the preceding March:
        const auto yearSplit = qDivMod<100>(year - (parts.month < 3 ? 1 : 0));
        const int centuryMod4 = qMod<4>(yearSplit.quotient);
        // Week-day shift for a century is 5, unless crossing a multiple of 400's Feb 29th.
        static_assert(qMod<7>(36524) == 5); // and (3 * 5) % 7 = 1
        // Formulae arrived at by case-by-case analysis of the values of
        // centuryMod4 and diff (and the above clue to multiply by -3 = 4):
        if (qMod<7>(diff * 4 + centuryMod4) < 4) {
            // Century offset maps qMod<7>(diff) in {5, 6} to -1, {3, 4} to +2, and {1, 2} to +1:
            year += (((qMod<7>(diff) + 3) / 2) % 4 - 1) * 100;
            maybe = julianFromParts(year > 0 ? year : year - 1, parts.month, parts.day);
            if (maybe && weekDayOfJulian(*maybe) == dow)
                return *maybe;
            Q_ASSERT(parts.month == 2 && parts.day == 29
                     && dow != int(Qt::Tuesday) && !(year % 100));
        }

    } else if (parts.month == 2 && parts.day == 29) {
        int year = parts.year < 0 ? parts.year + 1 : parts.year;
        // Feb 29th on a century needs to resolve to a multiple of 400 years.
        const auto yearSplit = qDivMod<100>(year);
        if (!yearSplit.remainder) {
            const auto centuryMod4 = qMod<4>(yearSplit.quotient);
            Q_ASSERT(centuryMod4); // or we'd have got a valid date to begin with.
            if (centuryMod4 == 1) // round down
                year -= 100;
            else // 2 or 3; round up
                year += (4 - centuryMod4) * 100;
            maybe = julianFromParts(year > 0 ? year : year - 1, parts.month, parts.day);
            if (maybe && weekDayOfJulian(*maybe) == dow) // (Can only happen for Tuesday.)
                return *maybe;
            Q_ASSERT(dow != int(Qt::Tuesday));
        }
    }
    return (std::numeric_limits<qint64>::min)();
}